

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_writable_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  uv_tcp_t server;
  uv_shutdown_t shutdown_req;
  uv_write_t write_req;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  char local_210 [248];
  char local_118 [80];
  char local_c8 [192];
  
  pcVar3 = "0.0.0.0";
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_230);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_tcp_init(pcVar3,local_210);
    if (iVar1 != 0) goto LAB_0017088a;
    pcVar3 = local_210;
    iVar1 = uv_tcp_bind(pcVar3,local_230,0);
    if (iVar1 != 0) goto LAB_0017088f;
    pcVar3 = local_210;
    iVar1 = uv_listen(pcVar3,0x80,0);
    if (iVar1 != 0) goto LAB_00170894;
    pcVar3 = local_210;
    iVar1 = uv_is_writable(pcVar3);
    if (iVar1 != 0) goto LAB_00170899;
    pcVar3 = local_210;
    iVar1 = uv_is_readable(pcVar3);
    if (iVar1 != 0) goto LAB_0017089e;
    local_220 = uv_buf_init("PING",4);
    pcVar3 = local_c8;
    iVar1 = uv_write(pcVar3,local_210,local_220,1,0);
    if (iVar1 != -0x20) goto LAB_001708a3;
    pcVar3 = local_118;
    iVar1 = uv_shutdown(pcVar3,local_210,0);
    if (iVar1 != -0x6b) goto LAB_001708a8;
    pcVar3 = local_210;
    iVar1 = uv_read_start(pcVar3,0,0);
    if (iVar1 != -0x6b) goto LAB_001708ad;
    uv_close(local_210,close_cb);
    pcVar3 = (char *)uv_default_loop();
    uv_run(pcVar3,0);
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001708b7;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0017088a:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0017088f:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_00170894:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_00170899:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0017089e:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001708a3:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001708a8:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001708ad:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_001708b7:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_writable_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_shutdown_t shutdown_req;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_writable((uv_stream_t*) &server));
  ASSERT(0 == uv_is_readable((uv_stream_t*) &server));

  buf = uv_buf_init("PING", 4);
  r = uv_write(&write_req, (uv_stream_t*) &server, &buf, 1, NULL);
  ASSERT(r == UV_EPIPE);
  r = uv_shutdown(&shutdown_req, (uv_stream_t*) &server, NULL);
  ASSERT(r == UV_ENOTCONN);
  r = uv_read_start((uv_stream_t*) &server, NULL, NULL);
  ASSERT(r == UV_ENOTCONN);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}